

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.2.13.10.hpp
# Opt level: O2

SummaryColumn * __thiscall
Catch::SummaryColumn::addRow(SummaryColumn *__return_storage_ptr__,SummaryColumn *this,size_t count)

{
  pointer pbVar1;
  ulong uVar2;
  pointer __rhs;
  string row;
  ReusableStringStream rss;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  ReusableStringStream::ReusableStringStream(&rss);
  std::ostream::_M_insert<unsigned_long>((ulong)rss.m_oss);
  std::__cxx11::stringbuf::str();
  pbVar1 = (this->rows).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (__rhs = (this->rows).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start; __rhs != pbVar1; __rhs = __rhs + 1) {
    while( true ) {
      uVar2 = __rhs->_M_string_length;
      if (row._M_string_length <= uVar2) break;
      std::operator+(&local_50,' ',__rhs);
      std::__cxx11::string::operator=((string *)__rhs,(string *)&local_50);
      std::__cxx11::string::~string((string *)&local_50);
    }
    while (row._M_string_length < uVar2) {
      std::operator+(&local_50,' ',&row);
      std::__cxx11::string::operator=((string *)&row,(string *)&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      uVar2 = __rhs->_M_string_length;
    }
  }
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->rows,&row);
  SummaryColumn(__return_storage_ptr__,this);
  std::__cxx11::string::~string((string *)&row);
  ReusableStringStream::~ReusableStringStream(&rss);
  return __return_storage_ptr__;
}

Assistant:

SummaryColumn addRow( std::size_t count ) {
        ReusableStringStream rss;
        rss << count;
        std::string row = rss.str();
        for (auto& oldRow : rows) {
            while (oldRow.size() < row.size())
                oldRow = ' ' + oldRow;
            while (oldRow.size() > row.size())
                row = ' ' + row;
        }
        rows.push_back(row);
        return *this;
    }